

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_186c9d3::joinImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,string *glue,size_t varIdx,cmMakefile *makefile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long in_R8;
  cmMakefile *in_R9;
  string_view separator;
  string_view value_00;
  string value;
  string local_48;
  cmStringRange local_28;
  
  local_28.Begin._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)args + in_R8 * 0x20 + 0x20);
  separator._M_str = (char *)varIdx;
  separator._M_len = (size_t)makefile;
  local_28.End._M_current = glue;
  cmJoin(&local_48,&local_28,separator,(string_view)ZEXT816(0));
  value_00._M_str = local_48._M_dataplus._M_p;
  value_00._M_len = local_48._M_string_length;
  cmMakefile::AddDefinition(in_R9,(string *)((long)args + in_R8 * 0x20),value_00);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
  }
  return SUB81(paVar1,0);
}

Assistant:

bool joinImpl(std::vector<std::string> const& args, std::string const& glue,
              const size_t varIdx, cmMakefile& makefile)
{
  std::string const& variableName = args[varIdx];
  // NOTE Items to concat/join placed right after the variable for
  // both `CONCAT` and `JOIN` sub-commands.
  std::string value = cmJoin(cmMakeRange(args).advance(varIdx + 1), glue);

  makefile.AddDefinition(variableName, value);
  return true;
}